

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_file.c
# Opt level: O0

gdIOCtx * gdNewFileCtx(FILE *f)

{
  fileIOCtx *ctx;
  FILE *f_local;
  
  if (f == (FILE *)0x0) {
    f_local = (FILE *)0x0;
  }
  else {
    f_local = (FILE *)gdMalloc(0x48);
    if (f_local == (FILE *)0x0) {
      f_local = (FILE *)0x0;
    }
    else {
      f_local->_IO_buf_end = (char *)f;
      *(code **)f_local = fileGetchar;
      f_local->_IO_read_end = (char *)filePutchar;
      f_local->_IO_read_ptr = (char *)fileGetbuf;
      f_local->_IO_read_base = (char *)filePutbuf;
      f_local->_IO_write_ptr = (char *)fileTell;
      f_local->_IO_write_base = (char *)fileSeek;
      f_local->_IO_write_end = (char *)gdFreeFileCtx;
    }
  }
  return (gdIOCtx *)f_local;
}

Assistant:

BGD_DECLARE(gdIOCtx *) gdNewFileCtx(FILE *f)
{
	fileIOCtx *ctx;

	if (f == NULL) return NULL;
	ctx = (fileIOCtx *)gdMalloc(sizeof(fileIOCtx));
	if(ctx == NULL) {
		return NULL;
	}

	ctx->f = f;

	ctx->ctx.getC = fileGetchar;
	ctx->ctx.putC = filePutchar;

	ctx->ctx.getBuf = fileGetbuf;
	ctx->ctx.putBuf = filePutbuf;

	ctx->ctx.tell = fileTell;
	ctx->ctx.seek = fileSeek;

	ctx->ctx.gd_free = gdFreeFileCtx;

	return (gdIOCtx *)ctx;
}